

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

uint32_t uloc_getLCID_63(char *localeID)

{
  UBool UVar1;
  int32_t iVar2;
  uint32_t uVar3;
  size_t sVar4;
  char *pcVar5;
  char local_1d8 [8];
  char tmpLocaleID [157];
  char collVal [96];
  int32_t len;
  uint32_t lcid;
  char langID [157];
  UErrorCode local_1c;
  char *pcStack_18;
  UErrorCode status;
  char *localeID_local;
  
  local_1c = U_ZERO_ERROR;
  if ((localeID == (char *)0x0) || (pcStack_18 = localeID, sVar4 = strlen(localeID), sVar4 < 2)) {
    localeID_local._4_4_ = 0;
  }
  else {
    localeID_local._4_4_ = uprv_convertToLCIDPlatform_63(pcStack_18);
    if (localeID_local._4_4_ == 0) {
      uloc_getLanguage_63(pcStack_18,(char *)&len,0x9d,&local_1c);
      UVar1 = U_FAILURE(local_1c);
      if (UVar1 == '\0') {
        pcVar5 = strchr(pcStack_18,0x40);
        if (pcVar5 != (char *)0x0) {
          iVar2 = uloc_getKeywordValue_63(pcStack_18,"collation",tmpLocaleID + 0x98,0x5f,&local_1c);
          UVar1 = U_SUCCESS(local_1c);
          if ((UVar1 != '\0') && (0 < iVar2)) {
            tmpLocaleID[(long)iVar2 + 0x98] = '\0';
            iVar2 = uloc_getBaseName_63(pcStack_18,local_1d8,0x9c,&local_1c);
            UVar1 = U_SUCCESS(local_1c);
            if ((UVar1 != '\0') && (0 < iVar2)) {
              local_1d8[iVar2] = '\0';
              iVar2 = uloc_setKeywordValue_63
                                ("collation",tmpLocaleID + 0x98,local_1d8,0x9c - iVar2,&local_1c);
              UVar1 = U_SUCCESS(local_1c);
              if ((UVar1 != '\0') && (0 < iVar2)) {
                local_1d8[iVar2] = '\0';
                uVar3 = uprv_convertToLCID_63((char *)&len,local_1d8,&local_1c);
                return uVar3;
              }
            }
          }
          local_1c = U_ZERO_ERROR;
        }
        localeID_local._4_4_ = uprv_convertToLCID_63((char *)&len,pcStack_18,&local_1c);
      }
      else {
        localeID_local._4_4_ = 0;
      }
    }
  }
  return localeID_local._4_4_;
}

Assistant:

U_CAPI uint32_t  U_EXPORT2
uloc_getLCID(const char* localeID)
{
    UErrorCode status = U_ZERO_ERROR;
    char       langID[ULOC_FULLNAME_CAPACITY];
    uint32_t   lcid = 0;

    /* Check for incomplete id. */
    if (!localeID || uprv_strlen(localeID) < 2) {
        return 0;
    }

    // Attempt platform lookup if available
    lcid = uprv_convertToLCIDPlatform(localeID);
    if (lcid > 0)
    {
        // Windows found an LCID, return that
        return lcid;
    }

    uloc_getLanguage(localeID, langID, sizeof(langID), &status);
    if (U_FAILURE(status)) {
        return 0;
    }

    if (uprv_strchr(localeID, '@')) {
        // uprv_convertToLCID does not support keywords other than collation.
        // Remove all keywords except collation.
        int32_t len;
        char collVal[ULOC_KEYWORDS_CAPACITY];
        char tmpLocaleID[ULOC_FULLNAME_CAPACITY];

        len = uloc_getKeywordValue(localeID, "collation", collVal,
            UPRV_LENGTHOF(collVal) - 1, &status);

        if (U_SUCCESS(status) && len > 0) {
            collVal[len] = 0;

            len = uloc_getBaseName(localeID, tmpLocaleID,
                UPRV_LENGTHOF(tmpLocaleID) - 1, &status);

            if (U_SUCCESS(status) && len > 0) {
                tmpLocaleID[len] = 0;

                len = uloc_setKeywordValue("collation", collVal, tmpLocaleID,
                    UPRV_LENGTHOF(tmpLocaleID) - len - 1, &status);

                if (U_SUCCESS(status) && len > 0) {
                    tmpLocaleID[len] = 0;
                    return uprv_convertToLCID(langID, tmpLocaleID, &status);
                }
            }
        }

        // fall through - all keywords are simply ignored
        status = U_ZERO_ERROR;
    }

    return uprv_convertToLCID(langID, localeID, &status);
}